

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathFrustum.h
# Opt level: O1

void __thiscall
Imath_3_2::Frustum<float>::setExc
          (Frustum<float> *this,float nearPlane,float farPlane,float fovx,float fovy,float aspect)

{
  domain_error *this_00;
  float fVar1;
  
  if (((fovx != 0.0) || (NAN(fovx))) && ((fovy != 0.0 || (NAN(fovy))))) {
    this_00 = (domain_error *)__cxa_allocate_exception(0x10);
    std::domain_error::domain_error(this_00,"fovx and fovy cannot both be non-zero.");
    __cxa_throw(this_00,&std::domain_error::typeinfo,std::domain_error::~domain_error);
  }
  if ((fovx != 0.0) || (NAN(fovx))) {
    fVar1 = tanf(fovx * 0.5);
    fVar1 = fVar1 * nearPlane;
    this->_right = fVar1;
    this->_left = -fVar1;
    fVar1 = ((fVar1 + fVar1) / aspect) * 0.5;
    this->_top = fVar1;
    this->_bottom = -fVar1;
  }
  else {
    fVar1 = tanf(fovy * 0.5);
    fVar1 = fVar1 * nearPlane;
    this->_top = fVar1;
    this->_bottom = -fVar1;
    fVar1 = (fVar1 + fVar1) * aspect * 0.5;
    this->_right = fVar1;
    this->_left = -fVar1;
  }
  this->_nearPlane = nearPlane;
  this->_farPlane = farPlane;
  this->_orthographic = false;
  return;
}

Assistant:

inline void
Frustum<T>::setExc (T nearPlane, T farPlane, T fovx, T fovy, T aspect)
{
    if (fovx != T (0) && fovy != T (0))
        throw std::domain_error ("fovx and fovy cannot both be non-zero.");

    const T two = static_cast<T> (2);

    if (fovx != T (0))
    {
        _right  = nearPlane * std::tan (fovx / two);
        _left   = -_right;
        _top    = ((_right - _left) / aspect) / two;
        _bottom = -_top;
    }
    else
    {
        _top    = nearPlane * std::tan (fovy / two);
        _bottom = -_top;
        _right  = (_top - _bottom) * aspect / two;
        _left   = -_right;
    }
    _nearPlane    = nearPlane;
    _farPlane     = farPlane;
    _orthographic = false;
}